

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O3

void __thiscall de::BlockBuffer<unsigned_char>::clear(BlockBuffer<unsigned_char> *this)

{
  deSemaphore dVar1;
  ScopedLock writeLock;
  ScopedLock readLock;
  
  deMutex_lock((this->m_readLock).m_mutex);
  deMutex_lock((this->m_writeLock).m_mutex);
  deSemaphore_destroy(this->m_fill);
  deSemaphore_destroy(this->m_empty);
  dVar1 = deSemaphore_create(0,(deSemaphoreAttributes *)0x0);
  this->m_fill = dVar1;
  dVar1 = deSemaphore_create(this->m_numBlocks,(deSemaphoreAttributes *)0x0);
  this->m_empty = dVar1;
  this->m_writeBlock = 0;
  this->m_writePos = 0;
  this->m_readBlock = 0;
  this->m_readPos = 0;
  this->m_canceled = 0;
  deMutex_unlock((this->m_writeLock).m_mutex);
  deMutex_unlock((this->m_readLock).m_mutex);
  return;
}

Assistant:

void BlockBuffer<T>::clear (void)
{
	ScopedLock readLock		(m_readLock);
	ScopedLock writeLock	(m_writeLock);

	deSemaphore_destroy(m_fill);
	deSemaphore_destroy(m_empty);

	m_fill			= deSemaphore_create(0, DE_NULL);
	m_empty			= deSemaphore_create(m_numBlocks, DE_NULL);
	m_writeBlock	= 0;
	m_writePos		= 0;
	m_readBlock		= 0;
	m_readPos		= 0;
	m_canceled		= DE_FALSE;

	DE_ASSERT(m_fill && m_empty);
}